

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

void __thiscall MTRand::seed(MTRand *this)

{
  FILE *__stream;
  size_t sVar1;
  time_t t;
  clock_t c;
  uint32 oneSeed;
  int iVar2;
  long lVar3;
  uint32 bigSeed [624];
  uint32 local_13a8 [625];
  
  __stream = fopen("/dev/urandom","rb");
  if (__stream != (FILE *)0x0) {
    lVar3 = 0;
    do {
      sVar1 = fread((void *)((long)local_13a8 + lVar3),8,1,__stream);
      if (sVar1 == 0) break;
      iVar2 = (int)lVar3;
      lVar3 = lVar3 + 8;
    } while (iVar2 != 0x1378);
    fclose(__stream);
    if (sVar1 != 0) {
      seed(this,local_13a8,0x270);
      return;
    }
  }
  t = time((time_t *)0x0);
  c = clock();
  oneSeed = hash(t,c);
  seed(this,oneSeed);
  return;
}

Assistant:

void MTRand::seed() {
  // Seed the generator with an array from /dev/urandom if available
  // Otherwise use a hash of time() and clock() values

  // First try getting an array from /dev/urandom
  FILE *urandom = fopen("/dev/urandom", "rb");
  if (urandom) {
    uint32 bigSeed[N];
    uint32 *s = bigSeed;
    int i = N;
    bool success = true;
    while (success && i--)
      success = fread(s++, sizeof(uint32), 1, urandom);
    fclose(urandom);
    if (success) {
      seed(bigSeed, N);
      return;
    }
  }

  // Was not successful, so use time() and clock() instead
  seed(hash(time(NULL), clock()));
}